

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

void amrex::UtilCreateCleanDirectory(string *path,bool callbarrier)

{
  ostringstream *this;
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined1 verbose;
  long *plVar5;
  long lVar6;
  ostream *poVar7;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_1f0;
  long local_1e0;
  undefined8 uStack_1d8;
  ostream **local_1d0;
  long local_1c8;
  ostream *local_1c0 [2];
  undefined1 local_1b0 [24];
  undefined8 auStack_198 [46];
  
  verbose = (undefined1)*(int *)(DAT_00816950 + -0x3c);
  if (*(int *)(DAT_00816950 + -0x3c) != *(int *)(DAT_00816950 + -0x30)) goto LAB_0051ef24;
  bVar3 = FileSystem::Exists(path);
  if (bVar3) {
    this = (ostringstream *)(local_1b0 + 0x10);
    pcVar1 = (path->_M_dataplus)._M_p;
    local_1b0._0_8_ = this;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,pcVar1,pcVar1 + path->_M_string_length);
    std::__cxx11::string::append((char *)local_1b0);
    UniqueString_abi_cxx11_();
    poVar7 = (ostream *)0xf;
    if ((ostringstream *)local_1b0._0_8_ != this) {
      poVar7 = (ostream *)local_1b0._16_8_;
    }
    if (poVar7 < (ostream *)(local_1b0._8_8_ + local_1c8)) {
      poVar7 = (ostream *)0xf;
      if (local_1d0 != local_1c0) {
        poVar7 = local_1c0[0];
      }
      if (poVar7 < (ostream *)(local_1b0._8_8_ + local_1c8)) goto LAB_0051ed80;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,local_1b0._0_8_);
    }
    else {
LAB_0051ed80:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_1b0,(ulong)local_1d0);
    }
    local_1f0 = &local_1e0;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_1e0 = *plVar5;
      uStack_1d8 = puVar4[3];
    }
    else {
      local_1e0 = *plVar5;
      local_1f0 = (long *)*puVar4;
    }
    lVar2 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,(ulong)(local_1c0[0] + 1));
    }
    verbose = SUB81(plVar5,0);
    if ((ostringstream *)local_1b0._0_8_ != this) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
    if (1 < system::verbose) {
      local_1b0._8_8_ = OutStream();
      local_1b0._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b0._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this);
      lVar6 = *(long *)(local_1b0._16_8_ - 0x18);
      *(undefined8 *)((long)auStack_198 + lVar6) =
           *(undefined8 *)(local_1b0._8_8_ + *(long *)(*(long *)local_1b0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"amrex::UtilCreateCleanDirectory():  ",0x24);
      verbose = (undefined1)lVar6;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(path->_M_dataplus)._M_p,path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this," exists.  Renaming to:  ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)local_1f0,lVar2);
      std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ - 0x18) + (char)this);
      std::ostream::put((char)this);
      std::ostream::flush();
      Print::~Print((Print *)local_1b0);
    }
    rename((path->_M_dataplus)._M_p,(char *)local_1f0);
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
  }
  bVar3 = FileSystem::CreateDirectories((FileSystem *)path,(string *)0x1ed,0,(bool)verbose);
  if (!bVar3) {
    CreateDirectoryFailed(path);
  }
LAB_0051ef24:
  if (callbarrier) {
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"amrex::UtilCreateCleanDirectory","");
    ParallelDescriptor::Barrier((string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
    }
  }
  return;
}

Assistant:

void
amrex::UtilCreateCleanDirectory (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::system::verbose > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectory():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
    if( ! amrex::UtilCreateDirectory(path, 0755)) {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectory");
  }
}